

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chimp_scan.hpp
# Opt level: O2

void duckdb::ChimpScanPartial<double>
               (ColumnSegment *segment,ColumnScanState *state,idx_t scan_count,Vector *result,
               idx_t result_offset)

{
  data_ptr_t pdVar1;
  ChimpScanState<double> *this;
  ulong uVar2;
  ulong group_size;
  ulong uVar3;
  
  this = (ChimpScanState<double> *)
         unique_ptr<duckdb::SegmentScanState,_std::default_delete<duckdb::SegmentScanState>,_true>::
         operator->(&state->scan_state);
  pdVar1 = result->data;
  Vector::SetVectorType(result,FLAT_VECTOR);
  for (uVar3 = 0; uVar2 = scan_count - uVar3, uVar3 <= scan_count && uVar2 != 0;
      uVar3 = uVar3 + group_size) {
    group_size = 0x400 - (ulong)((uint)this->total_value_count & 0x3ff);
    if (uVar2 < group_size) {
      group_size = uVar2;
    }
    ChimpScanState<double>::ScanGroup<unsigned_long>
              (this,(unsigned_long *)(pdVar1 + uVar3 * 8 + result_offset * 8),group_size);
  }
  return;
}

Assistant:

void ChimpScanPartial(ColumnSegment &segment, ColumnScanState &state, idx_t scan_count, Vector &result,
                      idx_t result_offset) {
	using INTERNAL_TYPE = typename ChimpType<T>::TYPE;
	auto &scan_state = state.scan_state->Cast<ChimpScanState<T>>();

	T *result_data = FlatVector::GetData<T>(result);
	result.SetVectorType(VectorType::FLAT_VECTOR);

	auto current_result_ptr = (INTERNAL_TYPE *)(result_data + result_offset);

	idx_t scanned = 0;
	while (scanned < scan_count) {
		idx_t to_scan = MinValue(scan_count - scanned, scan_state.LeftInGroup());
		scan_state.template ScanGroup<INTERNAL_TYPE>(current_result_ptr + scanned, to_scan);
		scanned += to_scan;
	}
}